

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  int iVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiWindow_conflict *pIVar6;
  ImGuiWindowStackData *pIVar7;
  ImVec2 IVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ImGuiID IVar13;
  ImGuiItemFlags IVar14;
  ImGuiContext_conflict1 *pIVar15;
  ImGuiItemStatusFlags IVar16;
  float fVar17;
  long lVar18;
  uint uVar19;
  char *__function;
  ImGuiWindow *window;
  
  pIVar15 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  iVar4 = (GImGui->CurrentWindowStack).Size;
  if ((iVar4 < 2) && (GImGui->WithinFrameScopeWithImplicitWindow == true)) {
    __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b28,"void ImGui::End()");
  }
  if (iVar4 < 1) {
    __assert_fail("g.CurrentWindowStack.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b2b,"void ImGui::End()");
  }
  if ((((pIVar5->Flags & 0x21000000U) == 0x1000000) && ((pIVar5->field_0x3e1 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b2f,"void ImGui::End()");
  }
  if ((pIVar5->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  if ((pIVar5->Flags & 0x20000000) == 0) {
    PopClipRect();
  }
  if ((pIVar5->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  if (((pIVar5->DockNode != (ImGuiDockNode *)0x0) && ((pIVar5->field_0x3e1 & 4) != 0)) &&
     (pIVar6 = pIVar5->DockNode->HostWindow, pIVar6 != (ImGuiWindow_conflict *)0x0)) {
    IVar8.y = ((pIVar5->DC).CursorMaxPos.y + (pIVar5->WindowPadding).y) - (pIVar6->WindowPadding).y;
    IVar8.x = ((pIVar5->DC).CursorMaxPos.x + (pIVar5->WindowPadding).x) - (pIVar6->WindowPadding).x;
    (pIVar6->DC).CursorMaxPos = IVar8;
  }
  lVar18 = (long)(pIVar15->CurrentWindowStack).Size;
  if (0 < lVar18) {
    pIVar7 = (pIVar15->CurrentWindowStack).Data;
    pIVar1 = &pIVar7[lVar18 + -1].ParentLastItemDataBackup;
    IVar13 = pIVar1->ID;
    IVar14 = pIVar1->InFlags;
    IVar16 = pIVar1->StatusFlags;
    fVar17 = (pIVar1->Rect).Min.x;
    pfVar2 = &pIVar7[lVar18 + -1].ParentLastItemDataBackup.Rect.Min.y;
    uVar9 = *(undefined8 *)pfVar2;
    uVar10 = *(undefined8 *)(pfVar2 + 2);
    pfVar2 = &pIVar7[lVar18 + -1].ParentLastItemDataBackup.NavRect.Min.y;
    uVar11 = *(undefined8 *)pfVar2;
    uVar12 = *(undefined8 *)(pfVar2 + 2);
    pIVar3 = &pIVar7[lVar18 + -1].ParentLastItemDataBackup.DisplayRect;
    IVar8 = pIVar3->Max;
    (pIVar15->LastItemData).DisplayRect.Min = pIVar3->Min;
    (pIVar15->LastItemData).DisplayRect.Max = IVar8;
    *(undefined8 *)&(pIVar15->LastItemData).NavRect.Min.y = uVar11;
    *(undefined8 *)&(pIVar15->LastItemData).NavRect.Max.y = uVar12;
    *(undefined8 *)&(pIVar15->LastItemData).Rect.Min.y = uVar9;
    *(undefined8 *)&(pIVar15->LastItemData).Rect.Max.y = uVar10;
    (pIVar15->LastItemData).ID = IVar13;
    (pIVar15->LastItemData).InFlags = IVar14;
    (pIVar15->LastItemData).StatusFlags = IVar16;
    (pIVar15->LastItemData).Rect.Min.x = fVar17;
    if ((pIVar5->Flags & 0x4000000) != 0) {
      iVar4 = (pIVar15->BeginPopupStack).Size;
      if (iVar4 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_001d3a3e;
      }
      (pIVar15->BeginPopupStack).Size = iVar4 + -1;
    }
    ImGuiStackSizes::CompareWithCurrentState
              (&(pIVar15->CurrentWindowStack).Data[lVar18 + -1].StackSizesOnBegin);
    iVar4 = (pIVar15->CurrentWindowStack).Size;
    if (iVar4 < 1) {
      __function = "void ImVector<ImGuiWindowStackData>::pop_back() [T = ImGuiWindowStackData]";
LAB_001d3a3e:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x71b,__function);
    }
    uVar19 = iVar4 - 1;
    (pIVar15->CurrentWindowStack).Size = uVar19;
    if (uVar19 == 0) {
      window = (ImGuiWindow *)0x0;
    }
    else {
      if (iVar4 == 1) goto LAB_001d39b5;
      window = (pIVar15->CurrentWindowStack).Data[(ulong)uVar19 - 1].Window;
    }
    SetCurrentWindow((ImGuiWindow_conflict *)window);
    if (pIVar15->CurrentWindow != (ImGuiWindow_conflict *)0x0) {
      SetCurrentViewport((ImGuiWindow_conflict *)window,pIVar15->CurrentWindow->Viewport);
      return;
    }
    return;
  }
LAB_001d39b5:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<ImGuiWindowStackData>::back() [T = ImGuiWindowStackData]");
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}